

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O0

uint8_t gb_read_joypad_input(MemoryBankController *mc)

{
  uint8_t data;
  MemoryBankController *mc_local;
  
  if ((mc->memory[0xff00] & 0x20) == 0) {
    mc_local._7_1_ = (uint8_t)((int)(uint)mc->buttons >> 4);
  }
  else if ((mc->memory[0xff00] & 0x10) == 0) {
    mc_local._7_1_ = mc->buttons;
  }
  else {
    mc_local._7_1_ = 0xff;
  }
  return mc_local._7_1_;
}

Assistant:

uint8_t gb_read_joypad_input(MemoryBankController* mc) {

    uint8_t data = mc->memory[JOYP];

    if ( !(data & Action_Button)) {
        return (mc->buttons >> 4) & 0x0F;
    }

    if ( !(data & Direction_Button)) {
        return mc->buttons & 0xFF;
    }

    return 0xFF;
}